

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crab-combat.cpp
# Opt level: O1

hash_type __thiscall game_hasher::operator()(game_hasher *this,game_t *game)

{
  _Elt_pointer puVar1;
  _Map_pointer ppuVar2;
  _Elt_pointer puVar3;
  _Elt_pointer puVar4;
  long lVar5;
  ulong uVar6;
  deque<unsigned_long,_std::allocator<unsigned_long>_> g;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_110;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  deque<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::deque
            ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c0,&game->first);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::deque(&local_70,&game->second);
  uVar6 = 0;
  lVar5 = 0;
  do {
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::deque
              ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_110,
               (deque<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&local_c0._M_impl.super__Deque_impl_data._M_map + lVar5));
    puVar1 = local_110._M_impl.super__Deque_impl_data._M_start._M_cur;
    puVar3 = local_110._M_impl.super__Deque_impl_data._M_start._M_last;
    ppuVar2 = local_110._M_impl.super__Deque_impl_data._M_start._M_node;
    while (puVar1 != local_110._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      puVar4 = puVar1 + 1;
      if (puVar4 == puVar3) {
        puVar4 = ppuVar2[1];
        ppuVar2 = ppuVar2 + 1;
        puVar3 = puVar4 + 0x40;
      }
      uVar6 = (uVar6 >> 2) + uVar6 * 0x40 + 0x9e3779b9 + (long)(int)*puVar1 ^ uVar6;
      puVar1 = puVar4;
    }
    std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_110);
    lVar5 = lVar5 + 0x50;
  } while (lVar5 != 0xa0);
  lVar5 = 0x50;
  do {
    std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
              ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&local_c0._M_impl.super__Deque_impl_data._M_map + lVar5));
    lVar5 = lVar5 + -0x50;
  } while (lVar5 != -0x50);
  return uVar6;
}

Assistant:

hash_type operator()(const game_t & game) const {
    std::size_t h = 0;
    for (auto g : {game.first, game.second})
      for (auto c : g)
        h ^= std::hash<int>{}(c)  + 0x9e3779b9 + (h << 6u) + (h >> 2u);
    return h;
  }